

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfinityTests.cpp
# Opt level: O2

void __thiscall IsNegativeInfinityTests::IsNegativeInfinityTests(IsNegativeInfinityTests *this)

{
  ut11::TestFixture::TestFixture(&this->super_TestFixture);
  (this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract =
       (_func_int **)&PTR__TestFixture_0027ef78;
  return;
}

Assistant:

virtual void Run() {
		Then("Is::NegativeInfinity(0.0f) is False", []() {
			AssertThat(ut11::Is::NegativeInfinity(0.0f), ut11::Is::False);
		});

		Then("Is::NegativeInfinity(-Infinity) is True", []() {
			AssertThat(ut11::Is::NegativeInfinity(-std::numeric_limits<float>::infinity()), ut11::Is::True);
		});

		Then("Is::NegativeInfinity(+Infinity) is False", []() {
			AssertThat(ut11::Is::NegativeInfinity(std::numeric_limits<float>::infinity()), ut11::Is::False);
		});

		Then("Is::NegativeInfinity is Operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::NegativeInfinity) >::value, ut11::Is::True);
		});

		Then("Is::NegativeInfinity has an error message", []() {
			AssertThat(ut11::Is::NegativeInfinity.GetErrorMessage(0.0f), ut11::Is::Not::EqualTo(""));
		});
	}